

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<Qt::Key>::clear(QList<Qt::Key> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<Qt::Key> *this_00;
  __off_t __length;
  QArrayDataPointer<Qt::Key> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<Qt::Key> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<Qt::Key> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<Qt::Key> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<Qt::Key>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<Qt::Key>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<Qt::Key> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<Qt::Key>::allocatedCapacity(in_RDI);
      QArrayDataPointer<Qt::Key>::QArrayDataPointer(pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<Qt::Key>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<Qt::Key>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<Qt::Key> *)QArrayDataPointer<Qt::Key>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<Qt::Key>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }